

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeInternalForcesContIntNoDamping
          (ChElementHexaANCF_3843 *this,ChVectorDynamic<> *Fi)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ulong uVar38;
  undefined1 (*pauVar39) [64];
  element_type *peVar40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  void *pvVar48;
  undefined8 *puVar49;
  double *pdVar50;
  char *pcVar51;
  ulong uVar52;
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  VectorNIP SPK2_4_Block;
  VectorNIP SPK2_5_Block;
  VectorNIP SPK2_3_Block;
  ChMatrixNMc<double,_3_*_NIP,_3> FC;
  VectorNIP SPK2_6_Block;
  VectorNIP SPK2_2_Block;
  MatrixNx3 QiCompact;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  VectorNIP SPK2_1_Block;
  Matrix3xN e_bar;
  Scalar local_5480;
  undefined1 *local_5478;
  double local_5470;
  undefined1 *local_5468;
  double local_5460;
  undefined1 *local_5458;
  double local_5450;
  undefined1 *local_5448;
  double local_5440;
  undefined1 *puStack_5438;
  undefined1 auStack_5430 [48];
  undefined1 local_5400 [64];
  undefined1 local_53c0 [64];
  undefined1 local_5380 [64];
  undefined1 local_5340 [64];
  undefined1 local_5300 [64];
  undefined1 local_52c0 [64];
  undefined1 local_5280 [64];
  double local_5240;
  undefined1 *puStack_5238;
  undefined1 auStack_5230 [48];
  undefined1 local_5200 [64];
  undefined1 local_51c0 [64];
  undefined1 local_5180 [64];
  undefined1 local_5140 [64];
  undefined1 local_5100 [64];
  undefined1 local_50c0 [64];
  undefined1 local_5080 [64];
  undefined1 local_5040 [64];
  undefined1 local_5000 [64];
  undefined1 local_4fc0 [64];
  undefined1 local_4f80 [64];
  undefined1 local_4f40 [64];
  undefined1 local_4f00 [64];
  undefined1 local_4ec0 [64];
  undefined1 local_4e80 [64];
  undefined1 local_4e40 [64];
  undefined1 local_4e00 [64];
  undefined1 local_4dc0 [64];
  undefined1 local_4d80 [64];
  undefined1 local_4d40 [64];
  undefined1 local_4d00 [64];
  undefined1 local_4cc0 [64];
  undefined1 local_4c80 [64];
  undefined1 local_4c40 [64];
  undefined1 local_4c00 [64];
  undefined1 local_4bc0 [64];
  undefined1 local_4b80 [64];
  undefined1 local_4b40 [64];
  undefined1 local_4b00 [64];
  undefined1 local_4ac0 [64];
  undefined1 local_4a80 [64];
  undefined1 local_4a40 [64];
  undefined1 local_4a00 [64];
  undefined1 local_49c0 [64];
  undefined1 local_4980 [64];
  undefined1 local_4940 [64];
  undefined1 local_4900 [64];
  undefined1 local_48c0 [64];
  undefined1 local_4880 [64];
  undefined1 local_4840 [64];
  undefined1 local_4800 [64];
  undefined1 local_47c0 [64];
  undefined1 local_4780 [64];
  undefined1 local_4740 [64];
  undefined1 local_4700 [64];
  undefined1 local_46c0 [64];
  undefined1 local_4680 [64];
  undefined1 local_4640 [64];
  undefined1 local_4600 [64];
  undefined1 local_45c0 [64];
  undefined1 local_4580 [64];
  double local_4540;
  undefined1 *puStack_4538;
  undefined1 auStack_4530 [48];
  undefined1 local_4500 [64];
  undefined1 local_44c0 [64];
  undefined1 local_4480 [64];
  undefined1 local_4440 [64];
  undefined1 local_4400 [64];
  undefined1 local_43c0 [64];
  undefined1 local_4380 [64];
  undefined1 local_4340 [64];
  undefined1 local_4300 [64];
  undefined1 local_42c0 [64];
  undefined1 local_4280 [64];
  undefined1 local_4240 [64];
  undefined1 local_4200 [64];
  undefined1 local_41c0 [64];
  undefined1 local_4180 [64];
  undefined1 local_4140 [64];
  undefined1 local_4100 [64];
  undefined1 local_40c0 [64];
  undefined1 local_4080 [64];
  undefined1 local_4040 [64];
  undefined1 local_4000 [64];
  undefined1 local_3fc0 [64];
  undefined1 local_3f80 [64];
  undefined1 local_3f40 [64];
  undefined1 local_3f00 [64];
  undefined1 local_3ec0 [64];
  undefined1 local_3e80 [64];
  undefined1 local_3e40 [64];
  undefined1 local_3e00 [64];
  undefined1 local_3dc0 [64];
  undefined1 local_3d80 [64];
  undefined1 local_3d40 [64];
  undefined1 local_3d00 [64];
  undefined1 local_3cc0 [64];
  undefined1 local_3c80 [64];
  undefined1 local_3c40 [64];
  undefined1 local_3c00 [64];
  undefined1 local_3bc0 [64];
  undefined1 local_3b80 [64];
  undefined1 local_3b40 [64];
  undefined1 local_3b00 [64];
  undefined1 local_3ac0 [64];
  undefined1 local_3a80 [64];
  undefined1 local_3a40 [64];
  undefined1 local_3a00 [64];
  undefined1 local_39c0 [64];
  undefined1 local_3980 [64];
  undefined1 local_3940 [64];
  undefined1 local_3900 [64];
  undefined1 local_38c0 [64];
  undefined1 local_3880 [64];
  undefined1 local_3840 [64];
  undefined1 local_3800 [64];
  undefined1 local_37c0 [64];
  undefined1 local_3780 [64];
  undefined1 local_3740 [64];
  undefined1 local_3700 [64];
  undefined1 local_36c0 [64];
  undefined1 local_3680 [64];
  undefined1 local_3640 [64];
  undefined1 local_3600 [64];
  undefined1 local_35c0 [64];
  undefined1 local_3580 [64];
  undefined1 local_3540 [64];
  undefined1 local_3500 [64];
  undefined1 local_34c0 [64];
  undefined1 local_3480 [64];
  undefined1 local_3440 [64];
  undefined1 local_3400 [64];
  undefined1 local_33c0 [64];
  undefined1 local_3380 [64];
  undefined1 local_3340 [64];
  undefined1 local_3300 [64];
  undefined1 local_32c0 [64];
  undefined1 local_3280 [64];
  undefined1 local_3240 [64];
  undefined1 local_3200 [64];
  undefined1 local_31c0 [64];
  undefined1 local_3180 [64];
  double local_3140;
  undefined1 *puStack_3138;
  undefined1 auStack_3130 [48];
  undefined1 local_3100 [64];
  undefined1 local_30c0 [64];
  undefined1 local_3080 [64];
  undefined1 local_3040 [64];
  undefined1 local_3000 [64];
  undefined1 local_2fc0 [64];
  undefined1 local_2f80 [64];
  double local_2f40;
  undefined1 *puStack_2f38;
  undefined1 auStack_2f30 [48];
  undefined1 local_2f00 [64];
  undefined1 local_2ec0 [64];
  undefined1 local_2e80 [64];
  undefined1 local_2e40 [64];
  undefined1 local_2e00 [64];
  undefined1 local_2dc0 [64];
  undefined1 local_2d80 [64];
  undefined1 local_2d40 [64];
  undefined1 local_2d00 [64];
  undefined1 local_2cc0 [64];
  undefined1 local_2c80 [64];
  undefined1 local_2c40 [64];
  undefined1 local_2c00 [64];
  undefined1 local_2bc0 [64];
  undefined1 local_2b80 [64];
  undefined1 local_2b40 [64];
  undefined1 local_2b00 [64];
  undefined1 local_2ac0 [64];
  undefined1 local_2a80 [64];
  undefined1 local_2a40 [64];
  undefined1 local_2a00 [64];
  undefined1 local_29c0 [64];
  undefined1 local_2980 [64];
  undefined1 local_2940 [64];
  undefined1 local_2900 [64];
  undefined1 local_28c0 [64];
  undefined1 local_2880 [64];
  undefined1 local_2840 [64];
  undefined1 local_2800 [64];
  undefined1 local_27c0 [64];
  undefined1 local_2780 [64];
  undefined1 local_2740 [64];
  undefined1 local_2700 [64];
  undefined1 local_26c0 [64];
  Matrix<double,_32,_3,_1,_32,_3> local_2680;
  undefined1 local_2380 [64];
  undefined1 local_2340 [64];
  undefined1 local_2300 [64];
  undefined1 local_22c0 [64];
  undefined1 local_2280 [64];
  undefined1 local_2240 [64];
  undefined1 local_2200 [64];
  undefined1 local_21c0 [64];
  undefined1 local_2180 [64];
  undefined1 local_2140 [64];
  undefined1 local_2100 [64];
  undefined1 local_20c0 [64];
  undefined1 local_2080 [64];
  undefined1 local_2040 [64];
  undefined1 local_2000 [64];
  undefined1 local_1fc0 [64];
  undefined1 local_1f80 [64];
  undefined1 local_1f40 [64];
  undefined1 local_1f00 [64];
  undefined1 local_1ec0 [64];
  undefined1 local_1e80 [64];
  undefined1 local_1e40 [64];
  undefined1 local_1e00 [64];
  undefined1 local_1dc0 [64];
  undefined1 local_1d80 [64];
  undefined1 local_1d40 [64];
  undefined1 local_1d00 [64];
  undefined1 local_1cc0 [64];
  undefined1 local_1c80 [64];
  undefined1 local_1c40 [64];
  undefined1 local_1c00 [64];
  undefined1 local_1bc0 [64];
  undefined1 local_1b80 [64];
  undefined1 local_1b40 [64];
  undefined1 local_1b00 [64];
  undefined1 local_1ac0 [64];
  undefined1 local_1a80 [64];
  undefined1 local_1a40 [64];
  undefined1 local_1a00 [64];
  undefined1 local_19c0 [64];
  undefined1 local_1980 [64];
  undefined1 local_1940 [64];
  undefined1 local_1900 [64];
  undefined1 local_18c0 [64];
  undefined1 local_1880 [64];
  undefined1 local_1840 [64];
  undefined1 local_1800 [64];
  undefined1 local_17c0 [64];
  undefined1 local_1780 [64];
  undefined1 local_1740 [64];
  undefined1 local_1700 [64];
  undefined1 local_16c0 [64];
  undefined1 local_1680 [64];
  undefined1 local_1640 [64];
  undefined1 local_1600 [64];
  undefined1 local_15c0 [64];
  undefined1 local_1580 [64];
  undefined1 local_1540 [64];
  undefined1 local_1500 [64];
  undefined1 local_14c0 [64];
  undefined1 local_1480 [64];
  undefined1 local_1440 [64];
  undefined1 local_1400 [64];
  undefined1 local_13c0 [64];
  undefined1 local_1380 [64];
  undefined1 local_1340 [64];
  undefined1 local_1300 [64];
  undefined1 local_12c0 [64];
  undefined1 local_1280 [64];
  undefined1 local_1240 [64];
  undefined1 local_1200 [64];
  undefined1 local_11c0 [64];
  undefined1 local_1180 [64];
  undefined1 local_1140 [64];
  undefined1 local_1100 [64];
  undefined1 local_10c0 [64];
  undefined1 local_1080 [64];
  undefined1 local_1040 [64];
  undefined1 local_1000 [64];
  undefined1 local_fc0 [64];
  undefined1 local_f80 [64];
  undefined1 local_f40 [64];
  undefined1 local_f00 [64];
  undefined1 local_ec0 [64];
  undefined1 local_e80 [64];
  undefined1 local_e40 [64];
  undefined1 local_e00 [64];
  undefined1 local_dc0 [64];
  undefined1 local_d80 [64];
  undefined1 local_d40 [64];
  undefined1 local_d00 [64];
  undefined1 local_cc0 [64];
  undefined1 local_c80 [64];
  undefined1 local_c40 [64];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  undefined1 local_b40 [64];
  undefined1 local_b00 [64];
  undefined1 local_ac0 [64];
  undefined1 local_a80 [64];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  undefined1 local_940 [64];
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  Matrix3xN local_380;
  
  CalcCoordMatrix(this,&local_380);
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      != 0x20) {
    pcVar51 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, 3, 32, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Transpose<Eigen::Matrix<double, 3, 32, 1>>, Option = 0]"
    ;
LAB_006eae40:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar51);
  }
  local_2380._8_8_ = &local_380;
  local_2380._0_8_ = &this->m_SD;
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      != 0xc0) {
    pcVar51 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 192, 3, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 192, 3, 0>]"
    ;
LAB_006eae62:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,pcVar51);
  }
  memset((Matrix<double,_192,_3,_0,_192,_3> *)local_4340,0,0x1200);
  local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.m_data.array
  [0] = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::Transpose<Eigen::Matrix<double,3,32,1,3,32>>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,192,3,0,192,3>>
            ((Matrix<double,_192,_3,_0,_192,_3> *)local_4340,
             (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_2380,
             (Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_> *)(local_2380 + 8),
             (Scalar *)&local_2680);
  uVar52 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
  uVar38 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
  if ((long)(uVar52 | uVar38) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, -1>]"
                 );
  }
  if ((uVar38 == 0x40) && (uVar52 == 1)) {
    pauVar39 = (undefined1 (*) [64])
               (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
    auVar53 = vbroadcastsd_avx512f(ZEXT816(0xbff0000000000000));
    auVar54 = vmulpd_avx512f(local_4340,local_4340);
    auVar55 = vmulpd_avx512f(local_3d40,local_3d40);
    auVar56 = vmulpd_avx512f(local_3740,local_3740);
    auVar57 = vmulpd_avx512f(local_4300,local_4300);
    auVar58 = vmulpd_avx512f(local_42c0,local_42c0);
    auVar59 = vmulpd_avx512f(local_4280,local_4280);
    auVar60 = vmulpd_avx512f(local_4240,local_4240);
    auVar61 = vmulpd_avx512f(local_4200,local_4200);
    auVar62 = vmulpd_avx512f(local_41c0,local_41c0);
    auVar63 = vmulpd_avx512f(local_35c0,local_35c0);
    auVar54 = vaddpd_avx512f(auVar54,auVar55);
    auVar54 = vaddpd_avx512f(auVar54,auVar56);
    auVar55 = vmulpd_avx512f(local_3d00,local_3d00);
    auVar55 = vaddpd_avx512f(auVar57,auVar55);
    auVar56 = vmulpd_avx512f(local_3700,local_3700);
    auVar54 = vaddpd_avx512f(auVar54,auVar53);
    auVar55 = vaddpd_avx512f(auVar55,auVar56);
    auVar56 = vmulpd_avx512f(local_3cc0,local_3cc0);
    auVar56 = vaddpd_avx512f(auVar58,auVar56);
    auVar57 = vmulpd_avx512f(local_36c0,local_36c0);
    auVar56 = vaddpd_avx512f(auVar56,auVar57);
    auVar57 = vmulpd_avx512f(local_3c80,local_3c80);
    auVar57 = vaddpd_avx512f(auVar59,auVar57);
    auVar58 = vmulpd_avx512f(local_3680,local_3680);
    auVar57 = vaddpd_avx512f(auVar57,auVar58);
    auVar58 = vmulpd_avx512f(local_3c40,local_3c40);
    auVar58 = vaddpd_avx512f(auVar60,auVar58);
    auVar59 = vmulpd_avx512f(local_3640,local_3640);
    auVar58 = vaddpd_avx512f(auVar58,auVar59);
    auVar59 = vmulpd_avx512f(local_3c00,local_3c00);
    auVar59 = vaddpd_avx512f(auVar61,auVar59);
    auVar60 = vmulpd_avx512f(local_3600,local_3600);
    auVar59 = vaddpd_avx512f(auVar59,auVar60);
    auVar60 = vmulpd_avx512f(local_3bc0,local_3bc0);
    auVar60 = vaddpd_avx512f(auVar62,auVar60);
    auVar60 = vaddpd_avx512f(auVar60,auVar63);
    local_4580 = local_4180;
    auVar61 = vmulpd_avx512f(local_4180,local_4180);
    local_4600 = local_3580;
    local_45c0 = local_3b80;
    auVar62 = vmulpd_avx512f(local_3b80,local_3b80);
    auVar61 = vaddpd_avx512f(auVar61,auVar62);
    auVar62 = vmulpd_avx512f(local_3580,local_3580);
    auVar63 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
    auVar61 = vaddpd_avx512f(auVar61,auVar62);
    auVar62 = vmulpd_avx512f(auVar63,*pauVar39);
    local_580 = vmulpd_avx512f(auVar54,auVar62);
    auVar54 = vaddpd_avx512f(auVar55,auVar53);
    auVar55 = vmulpd_avx512f(auVar63,pauVar39[1]);
    local_540 = vmulpd_avx512f(auVar54,auVar55);
    auVar54 = vaddpd_avx512f(auVar56,auVar53);
    auVar55 = vmulpd_avx512f(auVar63,pauVar39[2]);
    local_500 = vmulpd_avx512f(auVar54,auVar55);
    auVar54 = vaddpd_avx512f(auVar57,auVar53);
    auVar55 = vmulpd_avx512f(auVar63,pauVar39[3]);
    local_4c0 = vmulpd_avx512f(auVar54,auVar55);
    auVar54 = vaddpd_avx512f(auVar58,auVar53);
    auVar55 = vmulpd_avx512f(auVar63,pauVar39[4]);
    local_480 = vmulpd_avx512f(auVar54,auVar55);
    auVar54 = vaddpd_avx512f(auVar59,auVar53);
    auVar55 = vmulpd_avx512f(auVar63,pauVar39[5]);
    local_440 = vmulpd_avx512f(auVar54,auVar55);
    auVar54 = vaddpd_avx512f(auVar60,auVar53);
    auVar55 = vmulpd_avx512f(auVar63,pauVar39[6]);
    local_400 = vmulpd_avx512f(auVar54,auVar55);
    auVar54 = vaddpd_avx512f(auVar61,auVar53);
    auVar55 = vmulpd_avx512f(auVar63,pauVar39[7]);
    local_3c0 = vmulpd_avx512f(auVar54,auVar55);
    if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows == 0x40) &&
       ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols == 1)) {
      local_4840 = local_3cc0;
      local_47c0 = local_3d00;
      local_4740 = local_3d40;
      local_46c0 = local_4300;
      local_4680 = local_42c0;
      local_4640 = local_4280;
      local_49c0 = local_3640;
      local_4900 = local_3680;
      local_4980 = local_3c40;
      local_4940 = local_4240;
      pauVar39 = (undefined1 (*) [64])
                 (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      local_4700 = local_4340;
      local_4780 = local_3740;
      local_4800 = local_3700;
      local_4880 = local_36c0;
      local_2740 = local_35c0;
      local_2700 = local_3bc0;
      local_26c0 = local_41c0;
      local_4a80 = local_3600;
      local_4a40 = local_3c00;
      local_4a00 = local_4200;
      local_48c0 = local_3c80;
      local_4fc0 = local_3f80;
      local_5000 = local_3980;
      local_4f00 = local_3fc0;
      local_4f40 = local_39c0;
      local_4e40 = local_4000;
      local_4e80 = local_3a00;
      local_4d80 = local_4040;
      local_4dc0 = local_3a40;
      local_4c80 = local_4080;
      local_4d00 = local_3a80;
      auVar54 = vmulpd_avx512f(local_3f80,local_3f80);
      auVar55 = vmulpd_avx512f(local_3980,local_3980);
      auVar56 = vmulpd_avx512f(local_3fc0,local_3fc0);
      auVar57 = vmulpd_avx512f(local_39c0,local_39c0);
      auVar58 = vmulpd_avx512f(local_4000,local_4000);
      auVar59 = vmulpd_avx512f(local_3a00,local_3a00);
      auVar60 = vmulpd_avx512f(local_4040,local_4040);
      auVar61 = vmulpd_avx512f(local_3a40,local_3a40);
      auVar62 = vmulpd_avx512f(local_4080,local_4080);
      auVar64 = vmulpd_avx512f(local_3a80,local_3a80);
      local_4cc0 = local_3480;
      auVar65 = vmulpd_avx512f(local_3480,local_3480);
      local_4bc0 = local_40c0;
      auVar66 = vmulpd_avx512f(local_40c0,local_40c0);
      local_4b80 = local_3b00;
      local_4c40 = local_3ac0;
      local_4c00 = local_34c0;
      auVar67 = vmulpd_avx512f(local_3b00,local_3b00);
      local_4d40 = local_3440;
      auVar68 = vmulpd_avx512f(local_3440,local_3440);
      local_4e00 = local_3400;
      auVar69 = vmulpd_avx512f(local_3400,local_3400);
      local_4ec0 = local_33c0;
      auVar70 = vmulpd_avx512f(local_33c0,local_33c0);
      local_4f80 = local_3380;
      auVar71 = vmulpd_avx512f(local_3380,local_3380);
      local_4b40 = local_3500;
      local_4ac0 = local_4140;
      local_4b00 = local_3b40;
      auVar54 = vaddpd_avx512f(auVar54,auVar55);
      auVar55 = vaddpd_avx512f(auVar56,auVar57);
      auVar56 = vaddpd_avx512f(auVar58,auVar59);
      auVar57 = vaddpd_avx512f(auVar60,auVar61);
      auVar58 = vaddpd_avx512f(auVar62,auVar64);
      auVar58 = vaddpd_avx512f(auVar58,auVar65);
      auVar59 = vmulpd_avx512f(local_3ac0,local_3ac0);
      auVar60 = vmulpd_avx512f(local_34c0,local_34c0);
      auVar61 = vmulpd_avx512f(local_4100,local_4100);
      auVar57 = vaddpd_avx512f(auVar57,auVar68);
      auVar56 = vaddpd_avx512f(auVar56,auVar69);
      auVar55 = vaddpd_avx512f(auVar55,auVar70);
      auVar54 = vaddpd_avx512f(auVar54,auVar71);
      auVar59 = vaddpd_avx512f(auVar66,auVar59);
      auVar61 = vaddpd_avx512f(auVar61,auVar67);
      auVar62 = vmulpd_avx512f(local_3500,local_3500);
      auVar58 = vaddpd_avx512f(auVar58,auVar53);
      auVar57 = vaddpd_avx512f(auVar57,auVar53);
      auVar56 = vaddpd_avx512f(auVar56,auVar53);
      auVar55 = vaddpd_avx512f(auVar55,auVar53);
      auVar54 = vaddpd_avx512f(auVar54,auVar53);
      auVar59 = vaddpd_avx512f(auVar59,auVar60);
      auVar60 = vaddpd_avx512f(auVar61,auVar62);
      auVar61 = vmulpd_avx512f(local_4140,local_4140);
      auVar62 = vmulpd_avx512f(local_3b40,local_3b40);
      auVar61 = vaddpd_avx512f(auVar61,auVar62);
      auVar62 = vmulpd_avx512f(auVar63,*pauVar39);
      auVar60 = vaddpd_avx512f(auVar60,auVar53);
      auVar59 = vaddpd_avx512f(auVar59,auVar53);
      auVar64 = vmulpd_avx512f(local_3540,local_3540);
      local_5040 = local_3540;
      auVar61 = vaddpd_avx512f(auVar61,auVar64);
      auVar61 = vaddpd_avx512f(auVar61,auVar53);
      local_780 = vmulpd_avx512f(auVar61,auVar62);
      auVar61 = vmulpd_avx512f(auVar63,pauVar39[1]);
      local_740 = vmulpd_avx512f(auVar60,auVar61);
      auVar60 = vmulpd_avx512f(auVar63,pauVar39[2]);
      local_700 = vmulpd_avx512f(auVar59,auVar60);
      auVar59 = vmulpd_avx512f(auVar63,pauVar39[3]);
      local_6c0 = vmulpd_avx512f(auVar58,auVar59);
      auVar58 = vmulpd_avx512f(auVar63,pauVar39[4]);
      local_680 = vmulpd_avx512f(auVar57,auVar58);
      auVar57 = vmulpd_avx512f(auVar63,pauVar39[5]);
      local_640 = vmulpd_avx512f(auVar56,auVar57);
      auVar56 = vmulpd_avx512f(auVar63,pauVar39[6]);
      local_600 = vmulpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(auVar63,pauVar39[7]);
      local_5c0 = vmulpd_avx512f(auVar54,auVar55);
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows == 0x40) &&
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols == 1)) {
        pauVar39 = (undefined1 (*) [64])
                   (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data;
        local_2d40 = local_4100;
        local_2780 = local_3d80;
        local_27c0 = local_3780;
        auVar54 = vmulpd_avx512f(local_3d80,local_3d80);
        auVar55 = vmulpd_avx512f(local_3780,local_3780);
        local_2800 = local_3180;
        local_2880 = local_37c0;
        auVar56 = vmulpd_avx512f(local_3900,local_3900);
        auVar57 = vmulpd_avx512f(local_3940,local_3940);
        auVar58 = vmulpd_avx512f(local_3340,local_3340);
        auVar59 = vmulpd_avx512f(local_3300,local_3300);
        local_2b80 = local_3280;
        local_2bc0 = local_3ec0;
        local_2c40 = local_32c0;
        local_2c00 = local_38c0;
        auVar54 = vaddpd_avx512f(auVar54,auVar55);
        auVar55 = vmulpd_avx512f(local_3180,local_3180);
        auVar54 = vaddpd_avx512f(auVar54,auVar55);
        auVar55 = vmulpd_avx512f(local_37c0,local_37c0);
        local_28c0 = local_31c0;
        local_2840 = local_3dc0;
        auVar60 = vmulpd_avx512f(local_3dc0,local_3dc0);
        local_2940 = local_3800;
        auVar55 = vaddpd_avx512f(auVar60,auVar55);
        auVar60 = vmulpd_avx512f(local_31c0,local_31c0);
        auVar55 = vaddpd_avx512f(auVar55,auVar60);
        auVar60 = vmulpd_avx512f(local_3800,local_3800);
        local_2980 = local_3200;
        local_2900 = local_3e00;
        auVar61 = vmulpd_avx512f(local_3e00,local_3e00);
        local_2ac0 = local_3e40;
        auVar60 = vaddpd_avx512f(auVar61,auVar60);
        auVar61 = vmulpd_avx512f(local_3200,local_3200);
        auVar60 = vaddpd_avx512f(auVar60,auVar61);
        auVar61 = vmulpd_avx512f(local_3e40,local_3e40);
        local_29c0 = local_3240;
        auVar62 = vmulpd_avx512f(local_3240,local_3240);
        auVar64 = vmulpd_avx512f(local_3840,local_3840);
        local_2b00 = local_3840;
        auVar61 = vaddpd_avx512f(auVar61,auVar64);
        auVar64 = vmulpd_avx512f(local_32c0,local_32c0);
        local_2a00 = local_3880;
        auVar61 = vaddpd_avx512f(auVar61,auVar62);
        auVar62 = vmulpd_avx512f(local_3880,local_3880);
        auVar65 = vmulpd_avx512f(local_38c0,local_38c0);
        auVar66 = vmulpd_avx512f(local_3e80,local_3e80);
        local_2b40 = local_3e80;
        auVar67 = vmulpd_avx512f(local_3280,local_3280);
        auVar62 = vaddpd_avx512f(auVar66,auVar62);
        auVar66 = vmulpd_avx512f(local_3ec0,local_3ec0);
        auVar62 = vaddpd_avx512f(auVar62,auVar67);
        auVar65 = vaddpd_avx512f(auVar66,auVar65);
        auVar66 = vmulpd_avx512f(local_3f00,local_3f00);
        auVar67 = vmulpd_avx512f(local_3f40,local_3f40);
        auVar64 = vaddpd_avx512f(auVar65,auVar64);
        auVar56 = vaddpd_avx512f(auVar66,auVar56);
        local_2a40 = *pauVar39;
        auVar57 = vaddpd_avx512f(auVar67,auVar57);
        auVar60 = vaddpd_avx512f(auVar60,auVar53);
        auVar57 = vaddpd_avx512f(auVar57,auVar58);
        auVar56 = vaddpd_avx512f(auVar56,auVar59);
        auVar58 = vaddpd_avx512f(auVar61,auVar53);
        auVar59 = vaddpd_avx512f(auVar62,auVar53);
        auVar61 = vaddpd_avx512f(auVar64,auVar53);
        auVar62 = vaddpd_avx512f(auVar54,auVar53);
        auVar55 = vaddpd_avx512f(auVar55,auVar53);
        auVar54 = vaddpd_avx512f(auVar57,auVar53);
        auVar53 = vaddpd_avx512f(auVar56,auVar53);
        auVar56 = vmulpd_avx512f(local_2a40,auVar63);
        local_980 = vmulpd_avx512f(auVar54,auVar56);
        local_2c80 = pauVar39[1];
        auVar54 = vmulpd_avx512f(local_2c80,auVar63);
        local_940 = vmulpd_avx512f(auVar53,auVar54);
        local_2cc0 = pauVar39[2];
        auVar53 = vmulpd_avx512f(local_2cc0,auVar63);
        local_900 = vmulpd_avx512f(auVar61,auVar53);
        auVar56 = vmulpd_avx512f(local_3300,local_3500);
        local_2d00 = pauVar39[3];
        auVar53 = vmulpd_avx512f(local_2d00,auVar63);
        local_8c0 = vmulpd_avx512f(auVar59,auVar53);
        auVar57 = vmulpd_avx512f(local_3280,local_3480);
        auVar59 = vmulpd_avx512f(local_3840,local_3a40);
        local_2a80 = pauVar39[4];
        auVar53 = vmulpd_avx512f(local_2a80,auVar63);
        auVar61 = vmulpd_avx512f(local_4100,local_3f00);
        auVar64 = vmulpd_avx512f(local_3800,local_3a00);
        local_880 = vmulpd_avx512f(auVar58,auVar53);
        auVar53 = pauVar39[5];
        auVar54 = vmulpd_avx512f(auVar53,auVar63);
        local_840 = vmulpd_avx512f(auVar60,auVar54);
        auVar58 = vmulpd_avx512f(local_3940,local_3b40);
        auVar54 = pauVar39[6];
        auVar60 = vmulpd_avx512f(auVar54,auVar63);
        local_800 = vmulpd_avx512f(auVar55,auVar60);
        auVar60 = vmulpd_avx512f(local_3f40,local_4140);
        auVar55 = pauVar39[7];
        auVar63 = vmulpd_avx512f(auVar55,auVar63);
        auVar65 = vmulpd_avx512f(local_38c0,local_3ac0);
        local_7c0 = vmulpd_avx512f(auVar62,auVar63);
        auVar58 = vaddpd_avx512f(auVar60,auVar58);
        auVar60 = vmulpd_avx512f(local_3340,local_3540);
        auVar58 = vaddpd_avx512f(auVar58,auVar60);
        auVar60 = vmulpd_avx512f(local_3900,local_3b00);
        auVar60 = vaddpd_avx512f(auVar61,auVar60);
        auVar61 = vmulpd_avx512f(local_3ec0,local_40c0);
        auVar62 = vmulpd_avx512f(local_37c0,local_39c0);
        auVar63 = vmulpd_avx512f(local_37c0,local_3bc0);
        auVar56 = vaddpd_avx512f(auVar60,auVar56);
        auVar60 = vmulpd_avx512f(local_3e80,local_4080);
        local_b40 = vmulpd_avx512f(auVar56,local_2c80);
        auVar56 = vaddpd_avx512f(auVar61,auVar65);
        auVar61 = vmulpd_avx512f(local_32c0,local_34c0);
        auVar56 = vaddpd_avx512f(auVar56,auVar61);
        auVar61 = vmulpd_avx512f(local_3880,local_3a80);
        local_b00 = vmulpd_avx512f(auVar56,local_2cc0);
        auVar56 = vmulpd_avx512f(local_3f00,local_4300);
        auVar65 = vmulpd_avx512f(local_3300,local_3700);
        auVar60 = vaddpd_avx512f(auVar60,auVar61);
        auVar61 = vmulpd_avx512f(local_3e40,local_4040);
        auVar57 = vaddpd_avx512f(auVar60,auVar57);
        auVar60 = vmulpd_avx512f(local_3e00,local_4000);
        auVar66 = vmulpd_avx512f(local_3e00,local_4200);
        local_ac0 = vmulpd_avx512f(auVar57,local_2d00);
        auVar57 = vaddpd_avx512f(auVar61,auVar59);
        auVar59 = vmulpd_avx512f(local_3240,local_3440);
        auVar60 = vaddpd_avx512f(auVar60,auVar64);
        auVar61 = vmulpd_avx512f(local_3dc0,local_3fc0);
        auVar57 = vaddpd_avx512f(auVar57,auVar59);
        auVar59 = vmulpd_avx512f(local_3200,local_3400);
        auVar61 = vaddpd_avx512f(auVar61,auVar62);
        auVar62 = vmulpd_avx512f(local_3d80,local_3f80);
        auVar59 = vaddpd_avx512f(auVar60,auVar59);
        auVar60 = vmulpd_avx512f(local_31c0,local_33c0);
        auVar60 = vaddpd_avx512f(auVar61,auVar60);
        auVar61 = vmulpd_avx512f(local_3780,local_3980);
        auVar61 = vaddpd_avx512f(auVar62,auVar61);
        auVar62 = vmulpd_avx512f(local_3180,local_3380);
        auVar61 = vaddpd_avx512f(auVar61,auVar62);
        local_b80 = vmulpd_avx512f(auVar58,local_2a40);
        local_a80 = vmulpd_avx512f(auVar57,local_2a80);
        local_a40 = vmulpd_avx512f(auVar59,auVar53);
        local_a00 = vmulpd_avx512f(auVar60,auVar54);
        local_9c0 = vmulpd_avx512f(auVar61,auVar55);
        auVar57 = vmulpd_avx512f(local_3f40,local_4340);
        auVar58 = vmulpd_avx512f(local_3940,local_3d40);
        auVar57 = vaddpd_avx512f(auVar57,auVar58);
        auVar58 = vmulpd_avx512f(local_3340,local_3740);
        auVar57 = vaddpd_avx512f(auVar57,auVar58);
        auVar58 = vmulpd_avx512f(local_3900,local_3d00);
        local_d80 = vmulpd_avx512f(auVar57,local_2a40);
        auVar56 = vaddpd_avx512f(auVar56,auVar58);
        auVar57 = vmulpd_avx512f(local_3ec0,local_42c0);
        auVar56 = vaddpd_avx512f(auVar56,auVar65);
        auVar58 = vmulpd_avx512f(local_38c0,local_3cc0);
        local_d40 = vmulpd_avx512f(auVar56,local_2c80);
        auVar56 = vmulpd_avx512f(local_32c0,local_36c0);
        auVar57 = vaddpd_avx512f(auVar57,auVar58);
        auVar56 = vaddpd_avx512f(auVar57,auVar56);
        auVar57 = vmulpd_avx512f(local_3e80,local_4280);
        auVar58 = vmulpd_avx512f(local_3880,local_3c80);
        local_d00 = vmulpd_avx512f(auVar56,local_2cc0);
        auVar56 = vaddpd_avx512f(auVar57,auVar58);
        auVar57 = vmulpd_avx512f(local_3280,local_3680);
        auVar56 = vaddpd_avx512f(auVar56,auVar57);
        auVar57 = vmulpd_avx512f(local_3e40,local_4240);
        local_cc0 = vmulpd_avx512f(auVar56,local_2d00);
        auVar56 = vmulpd_avx512f(local_3840,local_3c40);
        auVar58 = vmulpd_avx512f(local_3240,local_3640);
        auVar56 = vaddpd_avx512f(auVar57,auVar56);
        auVar56 = vaddpd_avx512f(auVar56,auVar58);
        auVar57 = vmulpd_avx512f(local_3800,local_3c00);
        auVar58 = vmulpd_avx512f(local_3200,local_3600);
        auVar59 = vmulpd_avx512f(local_3780,local_3b80);
        local_c80 = vmulpd_avx512f(auVar56,local_2a80);
        auVar56 = vaddpd_avx512f(auVar66,auVar57);
        auVar57 = vmulpd_avx512f(local_3dc0,local_41c0);
        auVar60 = vmulpd_avx512f(local_31c0,local_35c0);
        auVar56 = vaddpd_avx512f(auVar56,auVar58);
        local_c40 = vmulpd_avx512f(auVar56,auVar53);
        auVar53 = vaddpd_avx512f(auVar57,auVar63);
        auVar56 = vmulpd_avx512f(local_3d80,local_4180);
        auVar53 = vaddpd_avx512f(auVar53,auVar60);
        local_c00 = vmulpd_avx512f(auVar53,auVar54);
        auVar53 = vaddpd_avx512f(auVar56,auVar59);
        auVar54 = vmulpd_avx512f(local_3180,local_3580);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_bc0 = vmulpd_avx512f(auVar53,auVar55);
        if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows == 0x40) &&
           ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
            .m_cols == 1)) {
          auVar53 = vmulpd_avx512f(local_3f80,local_4180);
          auVar54 = vmulpd_avx512f(local_3980,local_3b80);
          auVar53 = vaddpd_avx512f(auVar53,auVar54);
          auVar54 = vmulpd_avx512f(local_3380,local_3580);
          auVar53 = vaddpd_avx512f(auVar53,auVar54);
          auVar54 = vmulpd_avx512f(local_3fc0,local_41c0);
          auVar55 = vmulpd_avx512f(local_39c0,local_3bc0);
          auVar54 = vaddpd_avx512f(auVar54,auVar55);
          auVar55 = vmulpd_avx512f(local_33c0,local_35c0);
          auVar54 = vaddpd_avx512f(auVar54,auVar55);
          auVar55 = vmulpd_avx512f(local_4000,local_4200);
          auVar56 = vmulpd_avx512f(local_3a00,local_3c00);
          auVar55 = vaddpd_avx512f(auVar55,auVar56);
          auVar56 = vmulpd_avx512f(local_3400,local_3600);
          auVar55 = vaddpd_avx512f(auVar55,auVar56);
          auVar56 = vmulpd_avx512f(local_4040,local_4240);
          auVar57 = vmulpd_avx512f(local_3a40,local_3c40);
          auVar56 = vaddpd_avx512f(auVar56,auVar57);
          auVar57 = vmulpd_avx512f(local_3440,local_3640);
          auVar56 = vaddpd_avx512f(auVar56,auVar57);
          auVar57 = vmulpd_avx512f(local_4080,local_4280);
          auVar58 = vmulpd_avx512f(local_3a80,local_3c80);
          auVar57 = vaddpd_avx512f(auVar57,auVar58);
          auVar58 = vmulpd_avx512f(local_3480,local_3680);
          auVar57 = vaddpd_avx512f(auVar57,auVar58);
          auVar58 = vmulpd_avx512f(local_40c0,local_42c0);
          auVar59 = vmulpd_avx512f(local_3ac0,local_3cc0);
          auVar58 = vaddpd_avx512f(auVar58,auVar59);
          auVar59 = vmulpd_avx512f(local_34c0,local_36c0);
          auVar58 = vaddpd_avx512f(auVar58,auVar59);
          auVar59 = vmulpd_avx512f(local_4100,local_4300);
          auVar60 = vmulpd_avx512f(local_3b00,local_3d00);
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(local_3500,local_3700);
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(local_4140,local_4340);
          auVar61 = vmulpd_avx512f(local_3b40,local_3d40);
          auVar60 = vaddpd_avx512f(auVar60,auVar61);
          auVar61 = vmulpd_avx512f(local_3540,local_3740);
          auVar60 = vaddpd_avx512f(auVar60,auVar61);
          local_f80 = vmulpd_avx512f(auVar60,*pauVar39);
          local_f40 = vmulpd_avx512f(auVar59,pauVar39[1]);
          local_f00 = vmulpd_avx512f(auVar58,pauVar39[2]);
          local_ec0 = vmulpd_avx512f(auVar57,pauVar39[3]);
          local_e80 = vmulpd_avx512f(auVar56,pauVar39[4]);
          local_e40 = vmulpd_avx512f(auVar55,pauVar39[5]);
          local_e00 = vmulpd_avx512f(auVar54,pauVar39[6]);
          local_dc0 = vmulpd_avx512f(auVar53,pauVar39[7]);
          peVar40 = (this->m_material).
                    super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          this_00 = (this->m_material).
                    super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          local_2380._0_8_ =
               (peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
               .m_data.array[0];
          local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.m_data
          .array[0] = *(double *)
                       ((long)(peVar40->m_D).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                              .m_data.array + 8);
          local_2f40 = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x10);
          local_5478 = local_980;
          local_5468 = local_b80;
          local_5458 = local_d80;
          local_5448 = local_f80;
          uVar52 = 0xfffffffffffffff8;
          local_2380._8_8_ = local_580;
          local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.m_data
          .array[1] = (double)local_780;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_2380._0_8_;
          auVar53 = vbroadcastsd_avx512f(auVar2);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                         m_storage.m_data.array[0];
          auVar54 = vbroadcastsd_avx512f(auVar3);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_2f40;
          auVar55 = vbroadcastsd_avx512f(auVar4);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(double *)
                          ((long)(peVar40->m_D).
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                 m_storage.m_data.array + 0x18);
          auVar56 = vbroadcastsd_avx512f(auVar5);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(double *)
                          ((long)(peVar40->m_D).
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                 m_storage.m_data.array + 0x20);
          auVar57 = vbroadcastsd_avx512f(auVar6);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(double *)
                          ((long)(peVar40->m_D).
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                 m_storage.m_data.array + 0x28);
          auVar58 = vbroadcastsd_avx512f(auVar7);
          do {
            auVar59 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])(local_540 + uVar52 * 8));
            auVar60 = vmulpd_avx512f(auVar54,*(undefined1 (*) [64])(local_740 + uVar52 * 8));
            auVar61 = vmulpd_avx512f(auVar55,*(undefined1 (*) [64])(local_940 + uVar52 * 8));
            auVar62 = vmulpd_avx512f(auVar56,*(undefined1 (*) [64])(local_b40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar60);
            auVar59 = vaddpd_avx512f(auVar59,auVar61);
            auVar60 = vmulpd_avx512f(auVar57,*(undefined1 (*) [64])(local_d40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar62);
            auVar61 = vmulpd_avx512f(auVar58,*(undefined1 (*) [64])(local_f40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar60);
            auVar59 = vaddpd_avx512f(auVar59,auVar61);
            *(undefined1 (*) [64])(local_1140 + uVar52 * 8) = auVar59;
            uVar52 = uVar52 + 8;
          } while (uVar52 < 0x38);
          local_2380._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0x30);
          local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.m_data
          .array[0] = *(double *)
                       ((long)(peVar40->m_D).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                              .m_data.array + 0x38);
          local_4540 = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x40);
          uVar52 = 0xfffffffffffffff8;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = local_2380._0_8_;
          auVar53 = vbroadcastsd_avx512f(auVar8);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                         m_storage.m_data.array[0];
          auVar54 = vbroadcastsd_avx512f(auVar9);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_4540;
          auVar55 = vbroadcastsd_avx512f(auVar10);
          auVar11._8_8_ = 0;
          auVar11._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0x48);
          auVar56 = vbroadcastsd_avx512f(auVar11);
          auVar12._8_8_ = 0;
          auVar12._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0x50);
          auVar57 = vbroadcastsd_avx512f(auVar12);
          auVar13._8_8_ = 0;
          auVar13._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0x58);
          auVar58 = vbroadcastsd_avx512f(auVar13);
          puStack_2f38 = local_5478;
          do {
            auVar59 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])(local_540 + uVar52 * 8));
            auVar60 = vmulpd_avx512f(auVar54,*(undefined1 (*) [64])(local_740 + uVar52 * 8));
            auVar61 = vmulpd_avx512f(auVar55,*(undefined1 (*) [64])(local_940 + uVar52 * 8));
            auVar62 = vmulpd_avx512f(auVar56,*(undefined1 (*) [64])(local_b40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar60);
            auVar59 = vaddpd_avx512f(auVar59,auVar61);
            auVar60 = vmulpd_avx512f(auVar57,*(undefined1 (*) [64])(local_d40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar62);
            auVar61 = vmulpd_avx512f(auVar58,*(undefined1 (*) [64])(local_f40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar60);
            auVar59 = vaddpd_avx512f(auVar59,auVar61);
            *(undefined1 (*) [64])(local_2f00 + uVar52 * 8) = auVar59;
            uVar52 = uVar52 + 8;
          } while (uVar52 < 0x38);
          local_2380._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0x60);
          local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.m_data
          .array[0] = *(double *)
                       ((long)(peVar40->m_D).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                              .m_data.array + 0x68);
          local_5440 = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x70);
          uVar52 = 0xfffffffffffffff8;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = local_2380._0_8_;
          auVar53 = vbroadcastsd_avx512f(auVar14);
          auVar15._8_8_ = 0;
          auVar15._0_8_ =
               local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
               m_data.array[0];
          auVar54 = vbroadcastsd_avx512f(auVar15);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = local_5440;
          auVar55 = vbroadcastsd_avx512f(auVar16);
          auVar17._8_8_ = 0;
          auVar17._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0x78);
          auVar56 = vbroadcastsd_avx512f(auVar17);
          auVar18._8_8_ = 0;
          auVar18._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0x80);
          auVar57 = vbroadcastsd_avx512f(auVar18);
          auVar19._8_8_ = 0;
          auVar19._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0x88);
          auVar58 = vbroadcastsd_avx512f(auVar19);
          puStack_4538 = local_5478;
          do {
            auVar59 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])(local_540 + uVar52 * 8));
            auVar60 = vmulpd_avx512f(auVar54,*(undefined1 (*) [64])(local_740 + uVar52 * 8));
            auVar61 = vmulpd_avx512f(auVar55,*(undefined1 (*) [64])(local_940 + uVar52 * 8));
            auVar62 = vmulpd_avx512f(auVar56,*(undefined1 (*) [64])(local_b40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar60);
            auVar59 = vaddpd_avx512f(auVar59,auVar61);
            auVar60 = vmulpd_avx512f(auVar57,*(undefined1 (*) [64])(local_d40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar62);
            auVar61 = vmulpd_avx512f(auVar58,*(undefined1 (*) [64])(local_f40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar60);
            auVar59 = vaddpd_avx512f(auVar59,auVar61);
            *(undefined1 (*) [64])(local_4500 + uVar52 * 8) = auVar59;
            uVar52 = uVar52 + 8;
          } while (uVar52 < 0x38);
          local_2380._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0x90);
          local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.m_data
          .array[0] = *(double *)
                       ((long)(peVar40->m_D).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                              .m_data.array + 0x98);
          local_5240 = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0xa0);
          uVar52 = 0xfffffffffffffff8;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_2380._0_8_;
          auVar53 = vbroadcastsd_avx512f(auVar20);
          auVar21._8_8_ = 0;
          auVar21._0_8_ =
               local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
               m_data.array[0];
          auVar54 = vbroadcastsd_avx512f(auVar21);
          auVar22._8_8_ = 0;
          auVar22._0_8_ = local_5240;
          auVar55 = vbroadcastsd_avx512f(auVar22);
          auVar23._8_8_ = 0;
          auVar23._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0xa8);
          auVar56 = vbroadcastsd_avx512f(auVar23);
          auVar24._8_8_ = 0;
          auVar24._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0xb0);
          auVar57 = vbroadcastsd_avx512f(auVar24);
          auVar25._8_8_ = 0;
          auVar25._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0xb8);
          auVar58 = vbroadcastsd_avx512f(auVar25);
          puStack_5438 = local_5478;
          puStack_5238 = local_5478;
          do {
            auVar59 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])(local_540 + uVar52 * 8));
            auVar60 = vmulpd_avx512f(auVar54,*(undefined1 (*) [64])(local_740 + uVar52 * 8));
            auVar61 = vmulpd_avx512f(auVar55,*(undefined1 (*) [64])(local_940 + uVar52 * 8));
            auVar62 = vmulpd_avx512f(auVar56,*(undefined1 (*) [64])(local_b40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar60);
            auVar59 = vaddpd_avx512f(auVar59,auVar61);
            auVar60 = vmulpd_avx512f(auVar57,*(undefined1 (*) [64])(local_d40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar62);
            auVar61 = vmulpd_avx512f(auVar58,*(undefined1 (*) [64])(local_f40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar60);
            auVar59 = vaddpd_avx512f(auVar59,auVar61);
            *(undefined1 (*) [64])(local_5400 + uVar52 * 8) = auVar59;
            uVar52 = uVar52 + 8;
          } while (uVar52 < 0x38);
          local_2380._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0xc0);
          local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.m_data
          .array[0] = *(double *)
                       ((long)(peVar40->m_D).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                              .m_data.array + 200);
          local_3140 = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0xd0);
          uVar52 = 0xfffffffffffffff8;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = local_2380._0_8_;
          auVar53 = vbroadcastsd_avx512f(auVar26);
          auVar27._8_8_ = 0;
          auVar27._0_8_ =
               local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
               m_data.array[0];
          auVar54 = vbroadcastsd_avx512f(auVar27);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = local_3140;
          auVar55 = vbroadcastsd_avx512f(auVar28);
          auVar29._8_8_ = 0;
          auVar29._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0xd8);
          auVar56 = vbroadcastsd_avx512f(auVar29);
          auVar30._8_8_ = 0;
          auVar30._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0xe0);
          auVar57 = vbroadcastsd_avx512f(auVar30);
          auVar31._8_8_ = 0;
          auVar31._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0xe8);
          auVar58 = vbroadcastsd_avx512f(auVar31);
          do {
            auVar59 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])(local_540 + uVar52 * 8));
            auVar60 = vmulpd_avx512f(auVar54,*(undefined1 (*) [64])(local_740 + uVar52 * 8));
            auVar61 = vmulpd_avx512f(auVar55,*(undefined1 (*) [64])(local_940 + uVar52 * 8));
            auVar62 = vmulpd_avx512f(auVar56,*(undefined1 (*) [64])(local_b40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar60);
            auVar59 = vaddpd_avx512f(auVar59,auVar61);
            auVar60 = vmulpd_avx512f(auVar57,*(undefined1 (*) [64])(local_d40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar62);
            auVar61 = vmulpd_avx512f(auVar58,*(undefined1 (*) [64])(local_f40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar60);
            auVar59 = vaddpd_avx512f(auVar59,auVar61);
            *(undefined1 (*) [64])(local_5200 + uVar52 * 8) = auVar59;
            uVar52 = uVar52 + 8;
          } while (uVar52 < 0x38);
          local_2380._0_8_ =
               *(double *)
                ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array + 0xf0);
          local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.m_data
          .array[0] = *(double *)
                       ((long)(peVar40->m_D).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                              .m_data.array + 0xf8);
          local_5480 = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x100);
          local_5470 = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x108);
          local_5460 = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x110);
          local_5450 = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x118);
          uVar52 = 0xfffffffffffffff8;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = local_2380._0_8_;
          auVar53 = vbroadcastsd_avx512f(auVar32);
          auVar33._8_8_ = 0;
          auVar33._0_8_ =
               local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
               m_data.array[0];
          auVar54 = vbroadcastsd_avx512f(auVar33);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = local_5480;
          auVar55 = vbroadcastsd_avx512f(auVar34);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = local_5470;
          auVar56 = vbroadcastsd_avx512f(auVar35);
          auVar36._8_8_ = 0;
          auVar36._0_8_ = local_5460;
          auVar57 = vbroadcastsd_avx512f(auVar36);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = local_5450;
          auVar58 = vbroadcastsd_avx512f(auVar37);
          puStack_3138 = local_5478;
          do {
            auVar59 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])(local_540 + uVar52 * 8));
            auVar60 = vmulpd_avx512f(auVar54,*(undefined1 (*) [64])(local_740 + uVar52 * 8));
            auVar61 = vmulpd_avx512f(auVar55,*(undefined1 (*) [64])(local_940 + uVar52 * 8));
            auVar62 = vmulpd_avx512f(auVar56,*(undefined1 (*) [64])(local_b40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar60);
            auVar59 = vaddpd_avx512f(auVar59,auVar61);
            auVar60 = vmulpd_avx512f(auVar57,*(undefined1 (*) [64])(local_d40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar62);
            auVar61 = vmulpd_avx512f(auVar58,*(undefined1 (*) [64])(local_f40 + uVar52 * 8));
            auVar59 = vaddpd_avx512f(auVar59,auVar60);
            auVar59 = vaddpd_avx512f(auVar59,auVar61);
            *(undefined1 (*) [64])(local_3100 + uVar52 * 8) = auVar59;
            uVar52 = uVar52 + 8;
          } while (uVar52 < 0x38);
          auVar64._8_8_ = puStack_3138;
          auVar64._0_8_ = local_3140;
          auVar64._16_48_ = auStack_3130;
          auVar57._8_8_ = puStack_5238;
          auVar57._0_8_ = local_5240;
          auVar57._16_48_ = auStack_5230;
          auVar53 = vmulpd_avx512f(local_4340,local_1180);
          auVar54 = vmulpd_avx512f(local_4140,auVar64);
          auVar55 = vmulpd_avx512f(local_3f40,auVar57);
          auVar56 = vmulpd_avx512f(local_4300,local_1140);
          local_4e80 = local_3dc0;
          local_4ec0 = local_3f80;
          local_4f40 = local_3d80;
          local_49c0 = local_3b80;
          auVar53 = vaddpd_avx512f(auVar53,auVar54);
          auVar54 = vmulpd_avx512f(local_4100,local_3100);
          local_2380 = vaddpd_avx512f(auVar53,auVar55);
          auVar53 = vaddpd_avx512f(auVar56,auVar54);
          local_4b80 = local_3ec0;
          auVar54 = vmulpd_avx512f(local_3f00,local_5200);
          local_4ac0 = local_3f00;
          local_2340 = vaddpd_avx512f(auVar53,auVar54);
          local_4b00 = local_40c0;
          local_4b40 = local_42c0;
          auVar53 = vmulpd_avx512f(local_42c0,local_1100);
          auVar54 = vmulpd_avx512f(local_40c0,local_30c0);
          auVar53 = vaddpd_avx512f(auVar53,auVar54);
          auVar54 = vmulpd_avx512f(local_3ec0,local_51c0);
          local_2300 = vaddpd_avx512f(auVar53,auVar54);
          local_4bc0 = local_4080;
          auVar53 = vmulpd_avx512f(local_4080,local_3080);
          auVar54 = vmulpd_avx512f(local_4280,local_10c0);
          local_4c00 = local_4280;
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3e80,local_5180);
          local_4c40 = local_3e80;
          local_22c0 = vaddpd_avx512f(auVar53,auVar54);
          local_4d00 = local_3e40;
          local_4c80 = local_4040;
          local_4cc0 = local_4240;
          auVar53 = vmulpd_avx512f(local_4240,local_1080);
          auVar54 = vmulpd_avx512f(local_4040,local_3040);
          auVar53 = vaddpd_avx512f(auVar53,auVar54);
          auVar54 = vmulpd_avx512f(local_3e40,local_5140);
          local_2280 = vaddpd_avx512f(auVar53,auVar54);
          local_4d40 = local_4000;
          auVar53 = vmulpd_avx512f(local_4000,local_3000);
          auVar54 = vmulpd_avx512f(local_4200,local_1040);
          local_4d80 = local_4200;
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3e00,local_5100);
          local_4dc0 = local_3e00;
          local_2240 = vaddpd_avx512f(auVar53,auVar54);
          local_4e00 = local_3fc0;
          local_4e40 = local_41c0;
          auVar53 = vmulpd_avx512f(local_41c0,local_1000);
          auVar54 = vmulpd_avx512f(local_3fc0,local_2fc0);
          auVar53 = vaddpd_avx512f(auVar53,auVar54);
          auVar54 = vmulpd_avx512f(local_3dc0,local_50c0);
          local_2200 = vaddpd_avx512f(auVar53,auVar54);
          local_4f00 = local_4180;
          auVar53 = vmulpd_avx512f(local_4180,local_fc0);
          auVar54 = vmulpd_avx512f(local_3f80,local_2f80);
          auVar53 = vaddpd_avx512f(auVar53,auVar54);
          auVar54 = vmulpd_avx512f(local_3d80,local_5080);
          local_21c0 = vaddpd_avx512f(auVar53,auVar54);
          local_4fc0 = local_3b40;
          auVar53 = vmulpd_avx512f(auVar64,local_3b40);
          local_4f80 = local_3d40;
          auVar54 = vmulpd_avx512f(local_1180,local_3d40);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          local_5000 = local_3940;
          auVar54 = vmulpd_avx512f(auVar57,local_3940);
          local_1d80 = vaddpd_avx512f(auVar53,auVar54);
          local_4580 = local_3b00;
          auVar53 = vmulpd_avx512f(local_3100,local_3b00);
          local_5040 = local_3d00;
          auVar54 = vmulpd_avx512f(local_1140,local_3d00);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          local_45c0 = local_3900;
          auVar54 = vmulpd_avx512f(local_5200,local_3900);
          local_1d40 = vaddpd_avx512f(auVar53,auVar54);
          local_4640 = local_3ac0;
          auVar53 = vmulpd_avx512f(local_30c0,local_3ac0);
          local_4600 = local_3cc0;
          auVar54 = vmulpd_avx512f(local_1100,local_3cc0);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          local_4680 = local_38c0;
          auVar54 = vmulpd_avx512f(local_51c0,local_38c0);
          auVar55 = vmulpd_avx512f(local_51c0,local_32c0);
          local_1d00 = vaddpd_avx512f(auVar53,auVar54);
          local_4700 = local_3a80;
          auVar53 = vmulpd_avx512f(local_3080,local_3a80);
          local_46c0 = local_3c80;
          auVar54 = vmulpd_avx512f(local_10c0,local_3c80);
          auVar56 = vmulpd_avx512f(local_10c0,local_3680);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          local_4740 = local_3880;
          auVar54 = vmulpd_avx512f(local_5180,local_3880);
          auVar58 = vmulpd_avx512f(local_5180,local_3280);
          local_1cc0 = vaddpd_avx512f(auVar53,auVar54);
          local_47c0 = local_3a40;
          auVar53 = vmulpd_avx512f(local_3040,local_3a40);
          local_4780 = local_3c40;
          auVar54 = vmulpd_avx512f(local_1080,local_3c40);
          auVar59 = vmulpd_avx512f(local_1080,local_3640);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          local_4800 = local_3840;
          auVar54 = vmulpd_avx512f(local_5140,local_3840);
          auVar60 = vmulpd_avx512f(local_5140,local_3240);
          local_1c80 = vaddpd_avx512f(auVar53,auVar54);
          local_4880 = local_3a00;
          auVar53 = vmulpd_avx512f(local_3000,local_3a00);
          local_4840 = local_3c00;
          auVar54 = vmulpd_avx512f(local_1040,local_3c00);
          auVar61 = vmulpd_avx512f(local_1040,local_3600);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          local_48c0 = local_3800;
          auVar54 = vmulpd_avx512f(local_5100,local_3800);
          auVar62 = vmulpd_avx512f(local_5100,local_3200);
          local_1c40 = vaddpd_avx512f(auVar53,auVar54);
          local_4940 = local_39c0;
          auVar53 = vmulpd_avx512f(local_2fc0,local_39c0);
          local_4900 = local_3bc0;
          auVar54 = vmulpd_avx512f(local_1000,local_3bc0);
          auVar63 = vmulpd_avx512f(local_1000,local_35c0);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          local_4980 = local_37c0;
          auVar54 = vmulpd_avx512f(local_50c0,local_37c0);
          auVar65 = vmulpd_avx512f(local_50c0,local_31c0);
          local_1c00 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_fc0,local_3b80);
          auVar54 = vmulpd_avx512f(local_fc0,local_3580);
          local_4a00 = local_3980;
          auVar66 = vmulpd_avx512f(local_2f80,local_3980);
          auVar53 = vaddpd_avx512f(auVar53,auVar66);
          auVar66 = vmulpd_avx512f(local_5080,local_3780);
          local_4a40 = local_3780;
          auVar67 = vmulpd_avx512f(local_5080,local_3180);
          local_1bc0 = vaddpd_avx512f(auVar53,auVar66);
          local_4a80 = local_3740;
          auVar53 = vmulpd_avx512f(local_1180,local_3740);
          auVar57 = vmulpd_avx512f(auVar57,local_3340);
          auVar66 = vmulpd_avx512f(auVar64,local_3540);
          auVar53 = vaddpd_avx512f(auVar53,auVar66);
          local_1780 = vaddpd_avx512f(auVar53,auVar57);
          auVar53 = vmulpd_avx512f(local_1140,local_3700);
          auVar57 = vmulpd_avx512f(local_3100,local_3500);
          auVar53 = vaddpd_avx512f(auVar53,auVar57);
          auVar57 = vmulpd_avx512f(local_5200,local_3300);
          local_1740 = vaddpd_avx512f(auVar53,auVar57);
          auVar53 = vmulpd_avx512f(local_30c0,local_34c0);
          auVar57 = vmulpd_avx512f(local_1100,local_36c0);
          auVar53 = vaddpd_avx512f(auVar57,auVar53);
          local_1700 = vaddpd_avx512f(auVar53,auVar55);
          auVar53 = vmulpd_avx512f(local_3080,local_3480);
          auVar53 = vaddpd_avx512f(auVar56,auVar53);
          auVar55 = vmulpd_avx512f(local_3040,local_4240);
          local_16c0 = vaddpd_avx512f(auVar53,auVar58);
          auVar53 = vmulpd_avx512f(local_3040,local_3440);
          auVar53 = vaddpd_avx512f(auVar59,auVar53);
          auVar56 = vmulpd_avx512f(local_3080,local_4280);
          local_1680 = vaddpd_avx512f(auVar53,auVar60);
          auVar53 = vmulpd_avx512f(local_3000,local_3400);
          auVar53 = vaddpd_avx512f(auVar61,auVar53);
          auVar57 = vmulpd_avx512f(local_30c0,local_42c0);
          auVar58 = vmulpd_avx512f(local_30c0,local_3cc0);
          local_1640 = vaddpd_avx512f(auVar53,auVar62);
          auVar53 = vmulpd_avx512f(local_2fc0,local_33c0);
          auVar53 = vaddpd_avx512f(auVar63,auVar53);
          local_1600 = vaddpd_avx512f(auVar53,auVar65);
          auVar53 = vmulpd_avx512f(local_2f80,local_3380);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          local_15c0 = vaddpd_avx512f(auVar53,auVar67);
          auVar53 = vmulpd_avx512f(local_4340,auVar64);
          auVar54 = vmulpd_avx512f(local_2fc0,local_41c0);
          auVar65._8_8_ = puStack_2f38;
          auVar65._0_8_ = local_2f40;
          auVar65._16_48_ = auStack_2f30;
          auVar59 = vmulpd_avx512f(local_4140,auVar65);
          auVar59 = vaddpd_avx512f(auVar53,auVar59);
          auVar53._8_8_ = puStack_5438;
          auVar53._0_8_ = local_5440;
          auVar53._16_48_ = auStack_5430;
          auVar60 = vmulpd_avx512f(local_3f40,auVar53);
          local_2180 = vaddpd_avx512f(auVar59,auVar60);
          auVar59 = vmulpd_avx512f(local_4300,local_3100);
          auVar60 = vmulpd_avx512f(local_3000,local_4200);
          auVar61 = vmulpd_avx512f(local_4100,local_2f00);
          auVar59 = vaddpd_avx512f(auVar59,auVar61);
          auVar61 = vmulpd_avx512f(local_5400,local_3f00);
          local_2140 = vaddpd_avx512f(auVar59,auVar61);
          auVar59 = vmulpd_avx512f(local_2ec0,local_40c0);
          auVar61 = vmulpd_avx512f(local_2ec0,local_3ac0);
          auVar57 = vaddpd_avx512f(auVar57,auVar59);
          auVar59 = vmulpd_avx512f(local_53c0,local_3ec0);
          local_2100 = vaddpd_avx512f(auVar57,auVar59);
          auVar57 = vmulpd_avx512f(local_2e80,local_4080);
          auVar56 = vaddpd_avx512f(auVar56,auVar57);
          auVar57 = vmulpd_avx512f(local_5380,local_3e80);
          local_20c0 = vaddpd_avx512f(auVar56,auVar57);
          auVar56 = vmulpd_avx512f(local_2e40,local_4040);
          auVar55 = vaddpd_avx512f(auVar55,auVar56);
          auVar56 = vmulpd_avx512f(local_5340,local_3e40);
          local_2080 = vaddpd_avx512f(auVar55,auVar56);
          auVar55 = vmulpd_avx512f(local_2e00,local_4000);
          auVar55 = vaddpd_avx512f(auVar60,auVar55);
          auVar56 = vmulpd_avx512f(local_2f80,local_4180);
          auVar57 = vmulpd_avx512f(local_5300,local_3e00);
          local_2040 = vaddpd_avx512f(auVar55,auVar57);
          auVar55 = vmulpd_avx512f(local_2dc0,local_3fc0);
          auVar54 = vaddpd_avx512f(auVar54,auVar55);
          auVar55 = vmulpd_avx512f(local_52c0,local_3dc0);
          local_2000 = vaddpd_avx512f(auVar54,auVar55);
          auVar54 = vmulpd_avx512f(local_2d80,local_3f80);
          auVar54 = vaddpd_avx512f(auVar56,auVar54);
          auVar55 = vmulpd_avx512f(local_5280,local_3d80);
          local_1fc0 = vaddpd_avx512f(auVar54,auVar55);
          auVar54 = vmulpd_avx512f(auVar65,local_3b40);
          auVar55 = vmulpd_avx512f(local_3540,auVar65);
          auVar56 = vmulpd_avx512f(auVar64,local_3d40);
          auVar54 = vaddpd_avx512f(auVar56,auVar54);
          auVar56 = vmulpd_avx512f(auVar53,local_3940);
          auVar53 = vmulpd_avx512f(local_3340,auVar53);
          local_1b80 = vaddpd_avx512f(auVar54,auVar56);
          auVar54 = vmulpd_avx512f(local_2f00,local_3b00);
          auVar56 = vmulpd_avx512f(local_3100,local_3d00);
          auVar54 = vaddpd_avx512f(auVar56,auVar54);
          auVar56 = vmulpd_avx512f(local_5400,local_3900);
          local_1b40 = vaddpd_avx512f(auVar54,auVar56);
          auVar54 = vaddpd_avx512f(auVar58,auVar61);
          auVar56 = vmulpd_avx512f(local_53c0,local_38c0);
          auVar57 = vmulpd_avx512f(local_2e80,local_3a80);
          auVar58 = vmulpd_avx512f(local_3080,local_3c80);
          auVar59 = vmulpd_avx512f(local_3040,local_3c40);
          local_1b00 = vaddpd_avx512f(auVar54,auVar56);
          auVar54 = vaddpd_avx512f(auVar58,auVar57);
          auVar56 = vmulpd_avx512f(local_5380,local_3880);
          auVar57 = vmulpd_avx512f(local_2e40,local_3a40);
          local_1ac0 = vaddpd_avx512f(auVar54,auVar56);
          auVar54 = vmulpd_avx512f(local_3000,local_3c00);
          auVar56 = vaddpd_avx512f(auVar59,auVar57);
          auVar57 = vmulpd_avx512f(local_5340,local_3840);
          auVar58 = vmulpd_avx512f(local_2e00,local_3a00);
          local_1a80 = vaddpd_avx512f(auVar56,auVar57);
          auVar56 = vmulpd_avx512f(local_2fc0,local_3bc0);
          auVar54 = vaddpd_avx512f(auVar54,auVar58);
          auVar57 = vmulpd_avx512f(local_5300,local_3800);
          auVar58 = vmulpd_avx512f(local_2dc0,local_39c0);
          local_1a40 = vaddpd_avx512f(auVar54,auVar57);
          auVar54 = vmulpd_avx512f(local_2f80,local_3b80);
          auVar56 = vaddpd_avx512f(auVar56,auVar58);
          auVar57 = vmulpd_avx512f(local_52c0,local_37c0);
          auVar58 = vmulpd_avx512f(local_2d80,local_3980);
          local_1a00 = vaddpd_avx512f(auVar56,auVar57);
          auVar54 = vaddpd_avx512f(auVar54,auVar58);
          auVar56 = vmulpd_avx512f(local_5280,local_3780);
          auVar57 = vmulpd_avx512f(auVar64,local_3740);
          auVar55 = vaddpd_avx512f(auVar57,auVar55);
          local_19c0 = vaddpd_avx512f(auVar54,auVar56);
          local_1580 = vaddpd_avx512f(auVar55,auVar53);
          auVar53 = vmulpd_avx512f(local_3500,local_2f00);
          auVar54 = vmulpd_avx512f(local_3100,local_3700);
          auVar55 = vmulpd_avx512f(local_3300,local_5400);
          auVar56 = vmulpd_avx512f(local_36c0,local_30c0);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_34c0,local_2ec0);
          local_1540 = vaddpd_avx512f(auVar53,auVar55);
          auVar53 = vaddpd_avx512f(auVar56,auVar54);
          auVar54 = vmulpd_avx512f(local_32c0,local_53c0);
          local_1500 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3480,local_2e80);
          auVar54 = vmulpd_avx512f(local_3680,local_3080);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3280,local_5380);
          local_14c0 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3440,local_2e40);
          auVar54 = vmulpd_avx512f(local_3640,local_3040);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3240,local_5340);
          local_1480 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3400,local_2e00);
          auVar54 = vmulpd_avx512f(local_3600,local_3000);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3200,local_5300);
          local_1440 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_33c0,local_2dc0);
          auVar54 = vmulpd_avx512f(local_35c0,local_2fc0);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_31c0,local_52c0);
          local_1400 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3380,local_2d80);
          auVar54 = vmulpd_avx512f(local_3580,local_2f80);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3180,local_5280);
          local_13c0 = vaddpd_avx512f(auVar53,auVar54);
          auVar54._8_8_ = puStack_5438;
          auVar54._0_8_ = local_5440;
          auVar54._16_48_ = auStack_5430;
          auVar53 = vmulpd_avx512f(local_4140,auVar54);
          auVar58._8_8_ = puStack_5238;
          auVar58._0_8_ = local_5240;
          auVar58._16_48_ = auStack_5230;
          auVar54 = vmulpd_avx512f(local_4340,auVar58);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar61._8_8_ = puStack_4538;
          auVar61._0_8_ = local_4540;
          auVar61._16_48_ = auStack_4530;
          auVar54 = vmulpd_avx512f(local_3f40,auVar61);
          local_1f80 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_4100,local_5400);
          auVar54 = vmulpd_avx512f(local_4300,local_5200);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3f00,local_4500);
          local_1f40 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_40c0,local_53c0);
          auVar54 = vmulpd_avx512f(local_42c0,local_51c0);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3ec0,local_44c0);
          local_1f00 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_4080,local_5380);
          auVar54 = vmulpd_avx512f(local_4280,local_5180);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3e80,local_4480);
          local_1ec0 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_4040,local_5340);
          auVar54 = vmulpd_avx512f(local_4240,local_5140);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3e40,local_4440);
          local_1e80 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_4000,local_5300);
          auVar54 = vmulpd_avx512f(local_4200,local_5100);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3e00,local_4400);
          local_1e40 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3fc0,local_52c0);
          auVar54 = vmulpd_avx512f(local_41c0,local_50c0);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3dc0,local_43c0);
          local_1e00 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3f80,local_5280);
          auVar54 = vmulpd_avx512f(local_4180,local_5080);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3d80,local_4380);
          local_1dc0 = vaddpd_avx512f(auVar53,auVar54);
          auVar55._8_8_ = puStack_5438;
          auVar55._0_8_ = local_5440;
          auVar55._16_48_ = auStack_5430;
          auVar53 = vmulpd_avx512f(local_3b40,auVar55);
          auVar59._8_8_ = puStack_5238;
          auVar59._0_8_ = local_5240;
          auVar59._16_48_ = auStack_5230;
          auVar54 = vmulpd_avx512f(local_3d40,auVar59);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar62._8_8_ = puStack_4538;
          auVar62._0_8_ = local_4540;
          auVar62._16_48_ = auStack_4530;
          auVar54 = vmulpd_avx512f(local_3940,auVar62);
          local_1980 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3b00,local_5400);
          auVar54 = vmulpd_avx512f(local_3d00,local_5200);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3900,local_4500);
          local_1940 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3ac0,local_53c0);
          auVar54 = vmulpd_avx512f(local_3cc0,local_51c0);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_38c0,local_44c0);
          local_1900 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3a80,local_5380);
          auVar54 = vmulpd_avx512f(local_3c80,local_5180);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3880,local_4480);
          local_18c0 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3a40,local_5340);
          auVar54 = vmulpd_avx512f(local_3c40,local_5140);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3840,local_4440);
          local_1880 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3a00,local_5300);
          auVar54 = vmulpd_avx512f(local_3c00,local_5100);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3800,local_4400);
          local_1840 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_39c0,local_52c0);
          auVar54 = vmulpd_avx512f(local_3bc0,local_50c0);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_37c0,local_43c0);
          local_1800 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3980,local_5280);
          auVar54 = vmulpd_avx512f(local_3b80,local_5080);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3780,local_4380);
          local_17c0 = vaddpd_avx512f(auVar53,auVar54);
          auVar56._8_8_ = puStack_5438;
          auVar56._0_8_ = local_5440;
          auVar56._16_48_ = auStack_5430;
          auVar53 = vmulpd_avx512f(local_3540,auVar56);
          auVar60._8_8_ = puStack_5238;
          auVar60._0_8_ = local_5240;
          auVar60._16_48_ = auStack_5230;
          auVar54 = vmulpd_avx512f(local_3740,auVar60);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar63._8_8_ = puStack_4538;
          auVar63._0_8_ = local_4540;
          auVar63._16_48_ = auStack_4530;
          auVar54 = vmulpd_avx512f(local_3340,auVar63);
          local_1380 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3500,local_5400);
          auVar54 = vmulpd_avx512f(local_3700,local_5200);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3300,local_4500);
          local_1340 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_34c0,local_53c0);
          auVar54 = vmulpd_avx512f(local_36c0,local_51c0);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_32c0,local_44c0);
          local_1300 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3480,local_5380);
          auVar54 = vmulpd_avx512f(local_3680,local_5180);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3280,local_4480);
          local_12c0 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3440,local_5340);
          auVar54 = vmulpd_avx512f(local_3640,local_5140);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3240,local_4440);
          local_1280 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3400,local_5300);
          auVar54 = vmulpd_avx512f(local_3600,local_5100);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3200,local_4400);
          local_1240 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_33c0,local_52c0);
          auVar54 = vmulpd_avx512f(local_35c0,local_50c0);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_31c0,local_43c0);
          local_1200 = vaddpd_avx512f(auVar53,auVar54);
          auVar53 = vmulpd_avx512f(local_3380,local_5280);
          auVar54 = vmulpd_avx512f(local_3580,local_5080);
          auVar53 = vaddpd_avx512f(auVar54,auVar53);
          auVar54 = vmulpd_avx512f(local_3180,local_4380);
          local_11c0 = vaddpd_avx512f(auVar53,auVar54);
          if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_cols != 0xc0) {
            pcVar51 = 
            "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 192, 3, 0>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 192, 3, 0>, Option = 0]"
            ;
            goto LAB_006eae40;
          }
          if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows == 0x20) {
            memset(&local_2680,0,0x300);
            local_5480 = 1.0;
            Eigen::internal::
            generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,192,3,0,192,3>,Eigen::DenseShape,Eigen::DenseShape,8>
            ::scaleAndAddTo<Eigen::Matrix<double,32,3,1,32,3>>
                      (&local_2680,&this->m_SD,(Matrix<double,_192,_3,_0,_192,_3> *)local_2380,
                       &local_5480);
            pdVar50 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                      .m_data;
            if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 0x60) {
              if (pdVar50 != (double *)0x0) {
                free((void *)pdVar50[-1]);
              }
              pvVar48 = malloc(0x340);
              if (pvVar48 == (void *)0x0) {
                puVar49 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar49 = std::ostream::_M_insert<bool>;
                __cxa_throw(puVar49,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              *(void **)(((ulong)pvVar48 & 0xffffffffffffffc0) + 0x38) = pvVar48;
              pdVar50 = (double *)(((ulong)pvVar48 & 0xffffffffffffffc0) + 0x40);
              (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                   = pdVar50;
              (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
                   = 0x60;
            }
            uVar52 = 0xfffffffffffffff8;
            do {
              dVar41 = local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                       m_storage.m_data.array[uVar52 + 9];
              dVar42 = local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                       m_storage.m_data.array[uVar52 + 10];
              dVar43 = local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                       m_storage.m_data.array[uVar52 + 0xb];
              dVar44 = local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                       m_storage.m_data.array[uVar52 + 0xc];
              dVar45 = local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                       m_storage.m_data.array[uVar52 + 0xd];
              dVar46 = local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                       m_storage.m_data.array[uVar52 + 0xe];
              dVar47 = local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                       m_storage.m_data.array[uVar52 + 0xf];
              pdVar1 = pdVar50 + uVar52 + 8;
              *pdVar1 = local_2680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                        m_storage.m_data.array[uVar52 + 8];
              pdVar1[1] = dVar41;
              pdVar1[2] = dVar42;
              pdVar1[3] = dVar43;
              pdVar1[4] = dVar44;
              pdVar1[5] = dVar45;
              pdVar1[6] = dVar46;
              pdVar1[7] = dVar47;
              uVar52 = uVar52 + 8;
            } while (uVar52 < 0x58);
            return;
          }
          pcVar51 = 
          "void Eigen::PlainObjectBase<Eigen::Matrix<double, 32, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 32, 3, 1>]"
          ;
          goto LAB_006eae62;
        }
        pcVar51 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 64, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
        ;
        goto LAB_006eae1e;
      }
    }
  }
  pcVar51 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 64, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>>, Functor = Eigen::internal::mul_assign_op<double>]"
  ;
LAB_006eae1e:
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar51);
}

Assistant:

void ChElementHexaANCF_3843::ComputeInternalForcesContIntNoDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear material model (no damping).  For this style of method, the generalized internal force vector is
    // integrated across the volume of the element every time this calculation is performed.  For this element, this is
    // likely more efficient than the "Pre-Integration" style calculation method.  Note that the integrand for the
    // generalize internal force vector for a straight and normalized element is of order : 12 in xi, 12 in eta, and 12
    // in zeta. This requires GQ 7 points along the xi, eta, and zeta directions for "Full Integration". However, very
    // similar results can be obtained with fewer GQ point in each direction, resulting in significantly fewer
    // calculations.  Based on testing, this could be as low as 4x4x4

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // =============================================================================
    // Calculate the deformation gradient for all Gauss quadrature points in a single matrix multiplication.  Note
    // that since the shape function derivative matrix is ordered by columns, the resulting deformation gradient
    // will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31 ]
    // FC = [F12  F22  F32 ]
    //      [F13  F23  F33 ]
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> FC = m_SD.transpose() * e_bar.transpose();

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // The result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
    // corresponding Gauss point (m_kGQ) for efficiency.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    // =============================================================================

    // Each entry in E1 = kGQ*E11 = kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
    VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
    E1_Block.array() -= 1;
    E1_Block.array() *= 0.5 * m_kGQ.array();

    // Each entry in E2 = kGQ*E22 = kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
    VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                         FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                         FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
    E2_Block.array() -= 1;
    E2_Block.array() *= 0.5 * m_kGQ.array();

    // Each entry in E3 = kGQ*E33 = kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
    VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E3_Block.array() -= 1;
    E3_Block.array() *= 0.5 * m_kGQ.array();

    // Each entry in E4 = kGQ*2*E23 = kGQ*(F12*F13+F22*F23+F32*F33)
    VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E4_Block.array() *= m_kGQ.array();

    // Each entry in E5 = kGQ*2*E13 = kGQ*(F11*F13+F21*F23+F31*F33)
    VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E5_Block.array() *= m_kGQ.array();

    // Each entry in E6 = kGQ*2*E12 = (F11*F12+F21*F22+F31*F32)
    VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
    E6_Block.array() *= m_kGQ.array();

    // =============================================================================
    // Get the stiffness tensor in 6x6 matrix form
    // =============================================================================

    const ChMatrixNM<double, 6, 6>& D = GetMaterial()->Get_D();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have been scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point to make the calculation of the 2nd
    // Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                             D(0, 4) * E5_Block + D(0, 5) * E6_Block;
    VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                             D(1, 4) * E5_Block + D(1, 5) * E6_Block;
    VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                             D(2, 4) * E5_Block + D(2, 5) * E6_Block;
    VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                             D(3, 4) * E5_Block + D(3, 5) * E6_Block;
    VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                             D(4, 4) * E5_Block + D(4, 5) * E6_Block;
    VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                             D(5, 4) * E5_Block + D(5, 5) * E6_Block;

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ]
    //         = [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ]
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ]
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> P_Block;

    P_Block.template block<NIP, 1>(0, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_1_Block) +
                                           FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_6_Block) +
                                           FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_5_Block);
    P_Block.template block<NIP, 1>(0, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_1_Block) +
                                           FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_6_Block) +
                                           FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_5_Block);
    P_Block.template block<NIP, 1>(0, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_1_Block) +
                                           FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_6_Block) +
                                           FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_5_Block);

    P_Block.template block<NIP, 1>(NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_6_Block) +
                                             FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_2_Block) +
                                             FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_4_Block);
    P_Block.template block<NIP, 1>(NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_6_Block) +
                                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_2_Block) +
                                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_4_Block);
    P_Block.template block<NIP, 1>(NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_6_Block) +
                                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_2_Block) +
                                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_4_Block);

    P_Block.template block<NIP, 1>(2 * NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_5_Block) +
                                                 FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_4_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_3_Block);
    P_Block.template block<NIP, 1>(2 * NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_5_Block) +
                                                 FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_4_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_3_Block);
    P_Block.template block<NIP, 1>(2 * NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_5_Block) +
                                                 FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_4_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_3_Block);

    // =============================================================================
    // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix to get the generalized
    // force vector in matrix form (in the correct order if its calculated in row-major memory layout)
    // =============================================================================

    MatrixNx3 QiCompact = m_SD * P_Block;

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}